

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmState.cxx
# Opt level: O3

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* __thiscall
cmState::GetCacheEntryKeys_abi_cxx11_
          (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *__return_storage_ptr__,cmState *this)

{
  bool bVar1;
  CacheIterator cit;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  CacheIterator local_30;
  
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(__return_storage_ptr__,
            (long)*(int *)((long)&(((this->CacheManager)._M_t.
                                    super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>
                                    .super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl)->
                                  Cache)._M_t + 0x28));
  local_30 = cmCacheManager::GetCacheIterator
                       ((this->CacheManager)._M_t.
                        super___uniq_ptr_impl<cmCacheManager,_std::default_delete<cmCacheManager>_>.
                        _M_t.
                        super__Tuple_impl<0UL,_cmCacheManager_*,_std::default_delete<cmCacheManager>_>
                        .super__Head_base<0UL,_cmCacheManager_*,_false>._M_head_impl,(char *)0x0);
  cmCacheManager::CacheIterator::Begin(&local_30);
  while( true ) {
    bVar1 = cmCacheManager::CacheIterator::IsAtEnd(&local_30);
    if (bVar1) break;
    local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_50,*(long *)(local_30.Position._M_node + 1),
               (long)&(local_30.Position._M_node[1]._M_parent)->_M_color +
               *(long *)(local_30.Position._M_node + 1));
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
               __return_storage_ptr__,&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    cmCacheManager::CacheIterator::Next(&local_30);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::string> cmState::GetCacheEntryKeys() const
{
  std::vector<std::string> definitions;
  definitions.reserve(this->CacheManager->GetSize());
  cmCacheManager::CacheIterator cit = this->CacheManager->GetCacheIterator();
  for (cit.Begin(); !cit.IsAtEnd(); cit.Next()) {
    definitions.push_back(cit.GetName());
  }
  return definitions;
}